

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

void tty_debug(char *name)

{
  speed_t sVar1;
  termios attr;
  termios local_44;
  
  printf("DEBUG: %s\n",name);
  printf("DEBUG: \t\tTTY_Dev            = \"%s\"\n",TTY_Dev);
  printf("DEBUG: \t\tTTY_Fd             = %d\n",(ulong)(uint)TTY_Fd);
  if (-1 < TTY_Fd) {
    tcgetattr(TTY_Fd,&local_44);
    sVar1 = cfgetispeed(&local_44);
    printf("DEBUG: \t\tTTY_Mode.sg_ispeed = %#x\n",(ulong)sVar1);
    sVar1 = cfgetospeed(&local_44);
    printf("DEBUG: \t\tTTY_Mode.sg_ospeed = %#x\n",(ulong)sVar1);
  }
  puts("DEBUG:");
  puts("DEBUG: \t\tSymbol       Address        Contents");
  printf("DEBUG: \t\tIOPAGE       %p\n",Lisp_world + 0xff00);
  return;
}

Assistant:

void tty_debug(const char *name)
{
  printf("DEBUG: %s\n", name);
  printf("DEBUG: \t\tTTY_Dev            = \"%s\"\n", TTY_Dev);
  printf("DEBUG: \t\tTTY_Fd             = %d\n", TTY_Fd);

  if (TTY_Fd >= 0) {
    struct termios attr;
    tcgetattr(TTY_Fd, &attr);
    printf("DEBUG: \t\tTTY_Mode.sg_ispeed = %#x\n", (unsigned int)cfgetispeed(&attr));
    printf("DEBUG: \t\tTTY_Mode.sg_ospeed = %#x\n", (unsigned int)cfgetospeed(&attr));
  }

  printf("DEBUG:\n");
  printf("DEBUG: \t\tSymbol       Address        Contents\n");
  printf("DEBUG: \t\tIOPAGE       %p\n", (void *)NativeAligned2FromLAddr(IOPAGE_OFFSET));
  /* In the future, we could print out the various fields of DLTTYOut, DLTTYIn, and DLTTYPortCmd */
}